

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O3

void discordpp::from_json(json *j,field<discordpp::Team> *f)

{
  _Head_base<0UL,_discordpp::Team_*,_false> _Var1;
  _Head_base<0UL,_discordpp::Team_*,_false> this;
  state sVar2;
  undefined1 local_70 [8];
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_68;
  __uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_> local_58;
  unique_ptr<std::vector<discordpp::TeamMember,_std::allocator<discordpp::TeamMember>_>,_std::default_delete<std::vector<discordpp::TeamMember,_std::allocator<discordpp::TeamMember>_>_>_>
  local_48 [2];
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  _Head_base<0UL,_discordpp::Snowflake_*,_false> local_28;
  
  if (j->m_type == null) {
    _Var1._M_head_impl =
         (f->t_)._M_t.super___uniq_ptr_impl<discordpp::Team,_std::default_delete<discordpp::Team>_>.
         _M_t.super__Tuple_impl<0UL,_discordpp::Team_*,_std::default_delete<discordpp::Team>_>.
         super__Head_base<0UL,_discordpp::Team_*,_false>._M_head_impl;
    (f->t_)._M_t.super___uniq_ptr_impl<discordpp::Team,_std::default_delete<discordpp::Team>_>._M_t.
    super__Tuple_impl<0UL,_discordpp::Team_*,_std::default_delete<discordpp::Team>_>.
    super__Head_base<0UL,_discordpp::Team_*,_false>._M_head_impl = (Team *)0x0;
    sVar2 = nulled_e;
    if (_Var1._M_head_impl != (Team *)0x0) {
      std::default_delete<discordpp::Team>::operator()
                ((default_delete<discordpp::Team> *)f,_Var1._M_head_impl);
    }
  }
  else {
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::get_impl<discordpp::Team,_0>(local_70,j);
    this._M_head_impl = (Team *)operator_new(0x58);
    Team::Team(this._M_head_impl,(Team *)local_70);
    _Var1._M_head_impl =
         (f->t_)._M_t.super___uniq_ptr_impl<discordpp::Team,_std::default_delete<discordpp::Team>_>.
         _M_t.super__Tuple_impl<0UL,_discordpp::Team_*,_std::default_delete<discordpp::Team>_>.
         super__Head_base<0UL,_discordpp::Team_*,_false>._M_head_impl;
    (f->t_)._M_t.super___uniq_ptr_impl<discordpp::Team,_std::default_delete<discordpp::Team>_>._M_t.
    super__Tuple_impl<0UL,_discordpp::Team_*,_std::default_delete<discordpp::Team>_>.
    super__Head_base<0UL,_discordpp::Team_*,_false>._M_head_impl = this._M_head_impl;
    if (_Var1._M_head_impl != (Team *)0x0) {
      std::default_delete<discordpp::Team>::operator()
                ((default_delete<discordpp::Team> *)f,_Var1._M_head_impl);
    }
    if (local_28._M_head_impl != (Snowflake *)0x0) {
      operator_delete(local_28._M_head_impl,8);
    }
    local_28._M_head_impl = (Snowflake *)0x0;
    if (local_38._M_head_impl !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_38,local_38._M_head_impl);
    }
    local_38._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
    ;
    std::
    unique_ptr<std::vector<discordpp::TeamMember,_std::allocator<discordpp::TeamMember>_>,_std::default_delete<std::vector<discordpp::TeamMember,_std::allocator<discordpp::TeamMember>_>_>_>
    ::~unique_ptr(local_48);
    if ((_Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>)
        local_58._M_t.
        super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
        super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl != (Snowflake *)0x0) {
      operator_delete((void *)local_58._M_t.
                              super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>
                              .super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl,8);
    }
    local_58._M_t.
    super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
    super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl =
         (tuple<discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>)
         (_Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>)0x0;
    if ((_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_68._M_head_impl !=
        (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68._M_head_impl);
    }
    sVar2 = present_e;
  }
  f->s_ = sVar2;
  return;
}

Assistant:

void from_json(const nlohmann::json &j, field<T> &f) {
        if (j.is_null()) {
            f.t_ = nullptr;
            f.s_ = nulled_e;
        } else {
            f.t_ = std::make_unique<T>(j.get<T>());
            f.s_ = present_e;
        }
    }